

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateStackScriptFunctionInit
          (Lowerer *this,RegOpnd *regOpnd,FunctionInfoPtrPtr nestedInfo,Opnd *envOpnd,
          Instr *insertBeforeInstr)

{
  Func *func_00;
  uint32 offset;
  Opnd *vtableAddressOpnd;
  IndirOpnd *dst;
  AddrOpnd *src;
  Func *func;
  Instr *insertBeforeInstr_local;
  Opnd *envOpnd_local;
  FunctionInfoPtrPtr nestedInfo_local;
  RegOpnd *regOpnd_local;
  Lowerer *this_local;
  
  func_00 = this->m_func;
  vtableAddressOpnd = LoadVTableValueOpnd(this,insertBeforeInstr,VtableStackScriptFunction);
  GenerateScriptFunctionInit
            (this,regOpnd,vtableAddressOpnd,nestedInfo,envOpnd,insertBeforeInstr,false);
  offset = Js::StackScriptFunction::GetOffsetOfBoxedScriptFunction();
  dst = IR::IndirOpnd::New(regOpnd,offset,TyUint64,func_00,false);
  src = IR::AddrOpnd::NewNull(func_00);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
  return;
}

Assistant:

void
Lowerer::GenerateStackScriptFunctionInit(IR::RegOpnd * regOpnd, Js::FunctionInfoPtrPtr nestedInfo, IR::Opnd * envOpnd, IR::Instr * insertBeforeInstr)
{
    Func * func = this->m_func;
    GenerateScriptFunctionInit(regOpnd,
        LoadVTableValueOpnd(insertBeforeInstr, VTableValue::VtableStackScriptFunction),
        nestedInfo, envOpnd, insertBeforeInstr);
    InsertMove(IR::IndirOpnd::New(regOpnd, Js::StackScriptFunction::GetOffsetOfBoxedScriptFunction(), TyMachPtr, func),
        IR::AddrOpnd::NewNull(func), insertBeforeInstr);
}